

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall Parser::is_array(Parser *this)

{
  bool bVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  string local_38;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  Tokenizer::get_current_token_abi_cxx11_(&local_38,this->tokenizer);
  bVar1 = std::operator!=(&local_38,"[");
  std::__cxx11::string::~string((string *)&local_38);
  if (!bVar1) {
    query_tokenizer(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"]",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"[",&local_91);
    check_expected_x_after_y(this,&local_68,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Parser::is_array() {
    // only to be called once we know Tokenizer::type() == "IDENTIFIER"
    if (tokenizer.get_current_token() != "[") {
        return false;
    }
    query_tokenizer();

    check_expected_x_after_y("]", "[");
    return true;
}